

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O0

void __thiscall HighsMipSolverData::printSolutionSourceKey(HighsMipSolverData *this)

{
  long lVar1;
  initializer_list<int> __l;
  int iVar2;
  int iVar3;
  reference pvVar4;
  ostream *poVar5;
  HighsLogOptions *log_options_;
  undefined8 uVar6;
  long *in_RDI;
  char *pcVar7;
  int k_1;
  int line;
  int k;
  vector<int,_std::allocator<int>_> limits;
  int two_third_list;
  int third_list;
  int last_enum;
  stringstream ss;
  ostream *in_stack_fffffffffffffca0;
  allocator_type *in_stack_fffffffffffffcb8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffcc0;
  iterator in_stack_fffffffffffffcc8;
  size_type in_stack_fffffffffffffcd0;
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [36];
  int local_29c;
  string local_298 [36];
  int local_274;
  string local_270 [32];
  string local_250 [32];
  string local_230 [19];
  undefined1 in_stack_fffffffffffffde3;
  int in_stack_fffffffffffffde4;
  HighsMipSolverData *in_stack_fffffffffffffde8;
  int local_20c;
  string local_208 [52];
  undefined4 local_1d4;
  undefined4 local_1d0;
  undefined4 local_1cc;
  undefined4 *local_1c8;
  undefined8 local_1c0;
  vector<int,_std::allocator<int>_> local_1b8;
  undefined4 local_19c;
  undefined4 local_198;
  undefined4 local_194;
  stringstream local_190 [16];
  ostream local_180;
  
  std::__cxx11::stringstream::stringstream(local_190);
  local_194 = 0xf;
  local_198 = 5;
  local_19c = 10;
  local_1d4 = 5;
  local_1d0 = 10;
  local_1cc = 0xf;
  local_1c8 = &local_1d4;
  local_1c0 = 3;
  std::allocator<int>::allocator((allocator<int> *)0x629f5f);
  __l._M_len = in_stack_fffffffffffffcd0;
  __l._M_array = in_stack_fffffffffffffcc8;
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffcc0,__l,in_stack_fffffffffffffcb8);
  std::allocator<int>::~allocator((allocator<int> *)0x629f90);
  std::__cxx11::string::string(local_208);
  std::__cxx11::stringstream::str((string *)local_190);
  std::__cxx11::string::~string(local_208);
  local_20c = 0;
  while( true ) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_1b8,0);
    if (*pvVar4 <= local_20c) break;
    if (local_20c == 0) {
      std::operator<<(&local_180,"\nSrc: ");
    }
    else {
      std::operator<<(&local_180,"; ");
    }
    solutionSourceToString_abi_cxx11_
              (in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,(bool)in_stack_fffffffffffffde3);
    poVar5 = std::operator<<(&local_180,local_230);
    poVar5 = std::operator<<(poVar5," => ");
    solutionSourceToString_abi_cxx11_
              (in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,(bool)in_stack_fffffffffffffde3);
    std::operator<<(poVar5,local_250);
    std::__cxx11::string::~string(local_250);
    std::__cxx11::string::~string(local_230);
    local_20c = local_20c + 1;
  }
  log_options_ = (HighsLogOptions *)(*(long *)(*in_RDI + 8) + 0x380);
  std::__cxx11::stringstream::str();
  uVar6 = std::__cxx11::string::c_str();
  highsLogUser(log_options_,kInfo,"%s;\n",uVar6);
  std::__cxx11::string::~string(local_270);
  for (local_274 = 0; local_274 < 2; local_274 = local_274 + 1) {
    std::__cxx11::string::string(local_298);
    std::__cxx11::stringstream::str((string *)local_190);
    std::__cxx11::string::~string(local_298);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_1b8,(long)local_274);
    local_29c = *pvVar4;
    while( true ) {
      iVar2 = local_29c;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_1b8,(long)(local_274 + 1));
      iVar3 = local_29c;
      if (*pvVar4 <= iVar2) break;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_1b8,(long)local_274);
      if (iVar3 == *pvVar4) {
        std::operator<<(&local_180,"     ");
      }
      else {
        std::operator<<(&local_180,"; ");
      }
      solutionSourceToString_abi_cxx11_
                (in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,(bool)in_stack_fffffffffffffde3
                );
      in_stack_fffffffffffffca0 = std::operator<<(&local_180,local_2c0);
      poVar5 = std::operator<<(in_stack_fffffffffffffca0," => ");
      solutionSourceToString_abi_cxx11_
                (in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,(bool)in_stack_fffffffffffffde3
                );
      std::operator<<(poVar5,local_2e0);
      std::__cxx11::string::~string(local_2e0);
      std::__cxx11::string::~string(local_2c0);
      local_29c = local_29c + 1;
    }
    lVar1 = *(long *)(*in_RDI + 8);
    std::__cxx11::stringstream::str();
    uVar6 = std::__cxx11::string::c_str();
    pcVar7 = "";
    if (local_274 == 0) {
      pcVar7 = ";";
    }
    highsLogUser((HighsLogOptions *)(lVar1 + 0x380),kInfo,"%s%s\n",uVar6,pcVar7);
    std::__cxx11::string::~string(local_300);
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffca0);
  std::__cxx11::stringstream::~stringstream(local_190);
  return;
}

Assistant:

void HighsMipSolverData::printSolutionSourceKey() {
  std::stringstream ss;
  // Last MipSolutionSource enum is kSolutionSourceCleanup - which is
  // not a solution source, but used to force the last logging line to
  // be printed
  const int last_enum = kSolutionSourceCount - 1;
  int third_list = 5;
  int two_third_list = 10;
  std::vector<int> limits = {third_list, two_third_list, last_enum};

  ss.str(std::string());
  for (int k = 0; k < limits[0]; k++) {
    if (k == 0) {
      ss << "\nSrc: ";
    } else {
      ss << "; ";
    }
    ss << solutionSourceToString(k) << " => "
       << solutionSourceToString(k, false);
  }
  highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
               "%s;\n", ss.str().c_str());
  for (int line = 0; line < 2; line++) {
    ss.str(std::string());
    for (int k = limits[line]; k < limits[line + 1]; k++) {
      if (k == limits[line]) {
        ss << "     ";
      } else {
        ss << "; ";
      }
      ss << solutionSourceToString(k) << " => "
         << solutionSourceToString(k, false);
    }
    highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                 "%s%s\n", ss.str().c_str(), line == 0 ? ";" : "");
  }
}